

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationObject.cpp
# Opt level: O2

BlockActivationObject * __thiscall
Js::BlockActivationObject::Clone(BlockActivationObject *this,ScriptContext *scriptContext)

{
  DynamicType *type;
  int propertyId;
  DynamicObject *this_00;
  DynamicTypeHandler *pDVar1;
  Var value;
  ulong uVar2;
  int index;
  ulong uVar3;
  
  type = (DynamicType *)
         (this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.type.ptr;
  (*((type->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x61])();
  this_00 = (DynamicObject *)
            DynamicObject::NewObject<Js::BlockActivationObject>(scriptContext->recycler,type);
  pDVar1 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  uVar3 = 0;
  uVar2 = (ulong)(uint)pDVar1->slotCapacity;
  if (pDVar1->slotCapacity < 1) {
    uVar2 = uVar3;
  }
  while (index = (int)uVar3, (int)uVar2 != index) {
    propertyId = (*(this->super_ActivationObject).super_DynamicObject.super_RecyclableObject.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [8])(this,uVar3);
    value = DynamicObject::GetSlot((DynamicObject *)this,index);
    DynamicObject::SetSlot(this_00,propertyId,false,index,value);
    uVar3 = (ulong)(index + 1);
  }
  return (BlockActivationObject *)this_00;
}

Assistant:

BlockActivationObject* BlockActivationObject::Clone(ScriptContext *scriptContext)
    {
        DynamicType* type = this->GetDynamicType();
#if ENABLE_FIXED_FIELDS
        type->GetTypeHandler()->ClearSingletonInstance(); //We are going to share the type.
#endif

        BlockActivationObject* blockScopeClone = DynamicObject::NewObject<BlockActivationObject>(scriptContext->GetRecycler(), type);
        int slotCapacity = this->GetTypeHandler()->GetSlotCapacity();

        for (int i = 0; i < slotCapacity; i += 1)
        {
            DebugOnly(PropertyId propId = this->GetPropertyId(i));
            Var value = this->GetSlot(i);
            blockScopeClone->SetSlot(SetSlotArguments(propId, i, value));
        }

        return blockScopeClone;
    }